

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

type __thiscall
jsoncons::jsonpath::detail::
static_resources<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>::
new_selector<jsoncons::jsonpath::detail::identifier_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>
          (static_resources<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
           *this,identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *val)

{
  size_t sVar1;
  tuple<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  tVar2;
  pointer __p;
  identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_30;
  __uniq_ptr_impl<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  local_28;
  
  tVar2.
  super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
        )operator_new(0x40);
  *(undefined ***)
   tVar2.
   super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
   .
   super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
   ._M_head_impl = &PTR__jsonpath_selector_00b63cd8;
  sVar1 = (val->
          super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ).
          super_jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          .precedence_level_;
  *(long *)((long)tVar2.
                  super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                  .
                  super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
                  ._M_head_impl + 8) =
       *(long *)&(val->
                 super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ).
                 super_jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 .is_path_;
  *(size_t *)
   ((long)tVar2.
          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
          .
          super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
          ._M_head_impl + 0x10) = sVar1;
  *(undefined ***)
   tVar2.
   super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
   .
   super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
   ._M_head_impl = &PTR__jsonpath_selector_00b63c98;
  *(supertype **)
   ((long)tVar2.
          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
          .
          super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
          ._M_head_impl + 0x18) =
       (val->
       super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
       ).tail_;
  *(undefined ***)
   tVar2.
   super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
   .
   super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
   ._M_head_impl = &PTR__identifier_selector_00b640e0;
  std::__cxx11::wstring::wstring
            ((wstring *)
             ((long)tVar2.
                    super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                    .
                    super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
                    ._M_head_impl + 0x20),(wstring *)&val->identifier_);
  local_30 = (identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)0x0;
  local_28._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
  ._M_head_impl =
       (tuple<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
        )(tuple<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
          )tVar2.
           super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
           .
           super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
           ._M_head_impl;
  std::
  vector<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>>>
            ((vector<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>>>>
              *)(this + 0x20),
             (unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
              *)&local_28);
  if ((_Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
       )local_28._M_t.
        super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
        .
        super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
        ._M_head_impl !=
      (jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
       *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                          .
                          super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_28._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
  ._M_head_impl =
       (tuple<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
        )(_Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
          )0x0;
  if (local_30 !=
      (identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
       *)0x0) {
    std::
    default_delete<jsoncons::jsonpath::detail::identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>
    ::operator()((default_delete<jsoncons::jsonpath::detail::identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>
                  *)&local_30,local_30);
  }
  return *(type *)(*(long *)(this + 0x28) + -8);
}

Assistant:

typename std::enable_if<std::is_const<typename std::remove_reference<typename T::reference>::type>::value,const_selector_type*>::type    
        new_selector(T&& val)
        {
            const_selectors_.push_back(jsoncons::make_unique<T>(std::forward<T>(val)));
            return const_selectors_.back().get();
        }